

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,Benchmark *other)

{
  BenchmarkImp *pBVar1;
  pointer pcVar2;
  BenchmarkImp *pBVar3;
  
  this->_vptr_Benchmark = (_func_int **)&PTR__Benchmark_0012a7f0;
  pBVar3 = (BenchmarkImp *)operator_new(0x68);
  pBVar1 = other->imp_;
  (pBVar3->name_)._M_dataplus._M_p = (pointer)&(pBVar3->name_).field_2;
  pcVar2 = (pBVar1->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pBVar3,pcVar2,pcVar2 + (pBVar1->name_)._M_string_length);
  pBVar3->arg_count_ = pBVar1->arg_count_;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&pBVar3->args_,&pBVar1->args_);
  pBVar3->use_real_time_ = pBVar1->use_real_time_;
  pBVar3->min_time_ = pBVar1->min_time_;
  std::vector<int,_std::allocator<int>_>::vector(&pBVar3->thread_counts_,&pBVar1->thread_counts_);
  this->imp_ = pBVar3;
  return;
}

Assistant:

Benchmark::Benchmark(Benchmark const& other)
  : imp_(new BenchmarkImp(*other.imp_))
{
}